

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser_test.cpp
# Opt level: O2

void __thiscall
http_version_parsing_invalid03_Test::TestBody(http_version_parsing_invalid03_Test *this)

{
  bool bVar1;
  AssertHelper AStack_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  sub_string str;
  
  str = sub_string::literal<2ul>((char (*) [2])0x145beb);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    parse_request_method(&str);
  }
  testing::Message::Message((Message *)&local_20);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_28,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sorokin[P]echo/http_parser_test.cpp"
             ,0x73,
             "Expected: parse_request_method(str) throws an exception of type http_parsing_error.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_28,(Message *)&local_20);
  testing::internal::AssertHelper::~AssertHelper(&AStack_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
  return;
}

Assistant:

TEST(http_version_parsing, invalid03)
{
    sub_string str = sub_string::literal(" ");
    EXPECT_THROW(parse_request_method(str), http_parsing_error);
}